

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  int iVar1;
  uint uVar2;
  ImGuiTable *pIVar3;
  ImGuiWindow *pIVar4;
  char *pcVar5;
  ImGuiContext *pIVar6;
  char *pcVar7;
  
  pIVar6 = GImGui;
  iVar1 = (GImGui->CurrentWindowStack).Size;
  do {
    if (iVar1 < 1) {
      return;
    }
    while (pIVar3 = pIVar6->CurrentTable, pIVar3 != (ImGuiTable *)0x0) {
      if ((pIVar3->OuterWindow != pIVar6->CurrentWindow) &&
         (pIVar3->InnerWindow != pIVar6->CurrentWindow)) break;
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndTable() in \'%s\'",
                        pIVar3->OuterWindow->Name);
      }
      EndTable();
    }
    pIVar4 = pIVar6->CurrentWindow;
    if (pIVar4 == (ImGuiWindow *)0x0) {
      __assert_fail("window != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1bdb,"void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback, void *)");
    }
    while (pIVar6->CurrentTabBar != (ImGuiTabBar *)0x0) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndTabBar() in \'%s\'",pIVar4->Name);
      }
      EndTabBar();
    }
    while (0 < (pIVar4->DC).TreeDepth) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing TreePop() in \'%s\'",pIVar4->Name);
      }
      TreePop();
    }
    while ((int)(pIVar4->DC).StackSizesOnBegin.SizeOfGroupStack < (pIVar6->GroupStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndGroup() in \'%s\'",pIVar4->Name);
      }
      EndGroup();
    }
    iVar1 = (pIVar4->IDStack).Size;
    while (1 < iVar1) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopID() in \'%s\'",pIVar4->Name);
      }
      PopID();
      iVar1 = (pIVar4->IDStack).Size;
    }
    while( true ) {
      uVar2 = (pIVar6->ColorStack).Size;
      if ((int)uVar2 <= (int)(pIVar4->DC).StackSizesOnBegin.SizeOfColorStack) break;
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        if ((int)uVar2 < 1) {
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                        ,0x674,"T &ImVector<ImGuiColorMod>::back() [T = ImGuiColorMod]");
        }
        pcVar5 = pIVar4->Name;
        pcVar7 = GetStyleColorName((pIVar6->ColorStack).Data[(ulong)uVar2 - 1].Col);
        (*log_callback)(user_data,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s"
                        ,pcVar5,pcVar7);
      }
      PopStyleColor(1);
    }
    while ((int)(pIVar4->DC).StackSizesOnBegin.SizeOfStyleVarStack < (pIVar6->StyleVarStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopStyleVar() in \'%s\'",pIVar4->Name);
      }
      PopStyleVar(1);
    }
    while ((int)(pIVar4->DC).StackSizesOnBegin.SizeOfFocusScopeStack <
           (pIVar6->FocusScopeStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopFocusScope() in \'%s\'",pIVar4->Name);
      }
      PopFocusScope();
    }
    if ((pIVar6->CurrentWindowStack).Size == 1) {
      if (pIVar6->CurrentWindow->IsFallbackWindow != false) {
        return;
      }
      __assert_fail("g.CurrentWindow->IsFallbackWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1c01,"void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback, void *)");
    }
    if (pIVar4 != pIVar6->CurrentWindow) {
      __assert_fail("window == g.CurrentWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1c04,"void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback, void *)");
    }
    if ((pIVar4->Flags & 0x1000000) == 0) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing End() for \'%s\'",pIVar4->Name);
      }
      End();
    }
    else {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndChild() for \'%s\'",pIVar4->Name);
      }
      EndChild();
    }
    iVar1 = (pIVar6->CurrentWindowStack).Size;
  } while( true );
}

Assistant:

void    ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    // PVS-Studio V1044 is "Loop break conditions do not depend on the number of iterations"
    ImGuiContext& g = *GImGui;
    while (g.CurrentWindowStack.Size > 0)
    {
#ifdef IMGUI_HAS_TABLE
        while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
            EndTable();
        }
#endif
        ImGuiWindow* window = g.CurrentWindow;
        IM_ASSERT(window != NULL);
        while (g.CurrentTabBar != NULL) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
            EndTabBar();
        }
        while (window->DC.TreeDepth > 0)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
            TreePop();
        }
        while (g.GroupStack.Size > window->DC.StackSizesOnBegin.SizeOfGroupStack)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
            EndGroup();
        }
        while (window->IDStack.Size > 1)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
            PopID();
        }
        while (g.ColorStack.Size > window->DC.StackSizesOnBegin.SizeOfColorStack)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
            PopStyleColor();
        }
        while (g.StyleVarStack.Size > window->DC.StackSizesOnBegin.SizeOfStyleVarStack)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
            PopStyleVar();
        }
        while (g.FocusScopeStack.Size > window->DC.StackSizesOnBegin.SizeOfFocusScopeStack)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
            PopFocusScope();
        }
        if (g.CurrentWindowStack.Size == 1)
        {
            IM_ASSERT(g.CurrentWindow->IsFallbackWindow);
            break;
        }
        IM_ASSERT(window == g.CurrentWindow);
        if (window->Flags & ImGuiWindowFlags_ChildWindow)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndChild() for '%s'", window->Name);
            EndChild();
        }
        else
        {
            if (log_callback) log_callback(user_data, "Recovered from missing End() for '%s'", window->Name);
            End();
        }
    }
}